

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O0

int ply_read(p_ply ply)

{
  p_ply_element_conflict ptVar1;
  int iVar2;
  p_ply_element_conflict element;
  p_ply_argument argument;
  long i;
  p_ply ply_local;
  
  if (((ply != (p_ply)0x0) && (ply->fp != (FILE *)0x0)) && (ply->io_mode == PLY_READ)) {
    argument = (p_ply_argument)0x0;
    while( true ) {
      if (ply->nelements <= (long)argument) {
        return 1;
      }
      ptVar1 = ply->element;
      (ply->argument).element = ptVar1 + (long)argument;
      iVar2 = ply_read_element(ply,ptVar1 + (long)argument,&ply->argument);
      if (iVar2 == 0) break;
      argument = (p_ply_argument)((long)&argument->element + 1);
    }
    return 0;
  }
  __assert_fail("ply && ply->fp && ply->io_mode == PLY_READ",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                ,0x1bf,"int ply_read(p_ply)");
}

Assistant:

int ply_read(p_ply ply) {
    long i;
    p_ply_argument argument;
    assert(ply && ply->fp && ply->io_mode == PLY_READ);
    argument = &ply->argument;
    /* for each element type */
    for (i = 0; i < ply->nelements; i++) {
        p_ply_element element = &ply->element[i];
        argument->element = element;
        if (!ply_read_element(ply, element, argument))
            return 0;
    }
    return 1;
}